

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

string * __thiscall
raspicam::_private::Private_Impl_Still::getId_abi_cxx11_
          (string *__return_storage_ptr__,Private_Impl_Still *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  string str;
  ifstream file;
  char aux [100];
  char serial [1024];
  char line [1024];
  long *local_ad0 [2];
  long local_ac0 [2];
  long local_ab0 [4];
  byte abStack_a90 [488];
  undefined1 local_8a8 [112];
  char local_838 [1024];
  char local_438 [1032];
  
  local_838[0] = '\0';
  std::ifstream::ifstream(local_ab0,"/proc/cpuinfo",_S_in);
  if ((abStack_a90[*(long *)(local_ab0[0] + -0x18)] & 5) == 0) {
    if ((abStack_a90[*(long *)(local_ab0[0] + -0x18)] & 2) == 0) {
      bVar1 = false;
      do {
        std::ios::widen((char)*(undefined8 *)(local_ab0[0] + -0x18) + (char)local_ab0);
        std::istream::getline((char *)local_ab0,(long)local_438,'\0');
        local_ad0[0] = local_ac0;
        sVar4 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_ad0,local_438,local_438 + sVar4);
        lVar5 = std::__cxx11::string::find((char *)local_ad0,0x10d5ed,0);
        bVar6 = bVar1;
        if (lVar5 != -1) {
          iVar2 = __isoc99_sscanf(local_438,"%s : %s",local_8a8,local_838);
          bVar6 = true;
          if (iVar2 != 2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
                       ,0x6f);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x368);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"getId",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"Error parsing /proc/cpuinfo",0x1b);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            bVar6 = bVar1;
          }
        }
        if (local_ad0[0] != local_ac0) {
          operator_delete(local_ad0[0],local_ac0[0] + 1);
        }
      } while (((abStack_a90[*(long *)(local_ab0[0] + -0x18)] & 2) == 0) && (bVar1 = bVar6, !bVar6))
      ;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar4 = strlen(local_838);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_838,local_838 + sVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x35b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"getId",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Could not read /proc/cpuinfo",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar4 = strlen(local_838);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_838,local_838 + sVar4);
  }
  std::ifstream::~ifstream(local_ab0);
  return __return_storage_ptr__;
}

Assistant:

string Private_Impl_Still::getId() const{
            char serial[1024];
            serial[0]='\0';
            ifstream file ( "/proc/cpuinfo" );
            if ( !file ) {
                cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Could not read /proc/cpuinfo"<<endl;
                return serial;
            }
            //read lines until find serial
            bool found=false;
            while ( !file.eof() && !found ) {
                char line[1024];
                file.getline ( line,1024 );
                string str ( line );
                char aux[100];

                if ( str.find ( "Serial" ) !=string::npos ) {
                    if ( sscanf ( line,"%s : %s",aux,serial ) !=2 ) {
                        cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Error parsing /proc/cpuinfo"<<endl;
                    } else found=true;
                }
            };
            return serial;
        }